

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O3

int __thiscall Matrix::copy(Matrix *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Physical *pPVar1;
  undefined1 auVar2 [16];
  shared_count sVar3;
  int iVar4;
  ulong uVar5;
  ulong *puVar6;
  long lVar7;
  int *piVar8;
  double *pdVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  Physical *this_00;
  ulong uVar14;
  long lVar15;
  shared_count sStack_d0;
  Physical local_c8;
  shared_array<double> *psVar9;
  
  std::__cxx11::string::_M_assign((string *)&this->sMatrixName);
  this->nMatrixDimension = *(int *)(dst + 0xd8);
  this->nData = *(int *)(dst + 0xb8);
  this->bReference = (bool)((byte)src ^ 1);
  std::__cxx11::string::_M_assign((string *)&(this->super_Physical).physicalDescription);
  std::__cxx11::string::_M_assign((string *)&this->sMatrixName);
  Unit::operator=(&(this->super_Physical).physicalUnit,(Unit *)(dst + 0x30));
  uVar13 = (ulong)this->nMatrixDimension;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar13;
  uVar5 = SUB168(auVar2 * ZEXT816(0x98),0);
  uVar14 = uVar5 + 8;
  if (0xfffffffffffffff7 < uVar5) {
    uVar14 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(0x98),8) != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  puVar6 = (ulong *)operator_new__(uVar14);
  pPVar1 = (Physical *)(puVar6 + 1);
  *puVar6 = uVar13;
  if (uVar13 == 0) {
    this->pPhysicals = pPVar1;
    uVar11 = 0;
  }
  else {
    lVar12 = 0;
    this_00 = pPVar1;
    do {
      Physical::Physical(this_00);
      lVar12 = lVar12 + -0x98;
      this_00 = this_00 + 1;
    } while (uVar13 * -0x98 - lVar12 != 0);
    uVar11 = this->nMatrixDimension;
    this->pPhysicals = pPVar1;
    if (0 < (int)uVar11) {
      lVar12 = 0x30;
      lVar15 = 0;
      do {
        Physical::Physical(&local_c8,(Physical *)(*(long *)(dst + 0xd0) + lVar12 + -0x30));
        pPVar1 = this->pPhysicals;
        std::__cxx11::string::_M_assign
                  ((string *)((long)(pPVar1->physicalUnit).siUnits + lVar12 + -0x5c));
        *(double *)((long)(pPVar1->physicalUnit).siUnits + lVar12 + -0x3c) = local_c8.dQuantity;
        Unit::operator=((Unit *)((long)(pPVar1->physicalUnit).siUnits + lVar12 + -0x34),
                        &local_c8.physicalUnit);
        Physical::~Physical(&local_c8);
        lVar15 = lVar15 + 1;
        uVar11 = this->nMatrixDimension;
        lVar7 = (long)(int)uVar11;
        lVar12 = lVar12 + 0x98;
      } while (lVar15 < lVar7);
      goto LAB_00135d6d;
    }
  }
  lVar7 = (long)(int)uVar11;
LAB_00135d6d:
  uVar5 = 0xffffffffffffffff;
  if (-1 < (int)uVar11) {
    uVar5 = lVar7 << 2;
  }
  piVar8 = (int *)operator_new__(uVar5);
  this->pSize = piVar8;
  if ((int)uVar11 < 1) {
    piVar8 = (int *)operator_new__(uVar5);
    this->pMult = piVar8;
  }
  else {
    lVar12 = *(long *)(dst + 0xc0);
    uVar13 = 0;
    do {
      piVar8[uVar13] = *(int *)(lVar12 + uVar13 * 4);
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
    piVar8 = (int *)operator_new__(uVar5);
    this->pMult = piVar8;
    if (0 < (int)uVar11) {
      lVar12 = *(long *)(dst + 200);
      uVar5 = 0;
      do {
        piVar8[uVar5] = *(int *)(lVar12 + uVar5 * 4);
        uVar5 = uVar5 + 1;
      } while (uVar11 != uVar5);
    }
  }
  if (this->bReference == false) {
    uVar5 = 0xffffffffffffffff;
    if (-1 < (long)this->nData) {
      uVar5 = (long)this->nData * 8;
    }
    pdVar10 = (double *)operator_new__(uVar5);
    this->pData = pdVar10;
    boost::detail::shared_count::shared_count<double*,MatrixDataDeleter>
              (&sStack_d0,pdVar10,(MatrixDataDeleter)0x0);
    sVar3.pi_ = sStack_d0.pi_;
    sStack_d0.pi_ = (sp_counted_base *)0x0;
    local_c8._vptr_Physical = (_func_int **)(this->matrixParent).px;
    local_c8.physicalDescription._M_dataplus._M_p = (pointer)(this->matrixParent).pn.pi_;
    (this->matrixParent).px = pdVar10;
    (this->matrixParent).pn.pi_ = sVar3.pi_;
    boost::detail::shared_count::~shared_count((shared_count *)&local_c8.physicalDescription);
    boost::detail::shared_count::~shared_count(&sStack_d0);
    iVar4 = this->nData;
    if (0 < (long)iVar4) {
      lVar12 = *(long *)(dst + 0xa0);
      pdVar10 = this->pData;
      lVar15 = 0;
      do {
        pdVar10[lVar15] = *(double *)(lVar12 + lVar15 * 8);
        lVar15 = lVar15 + 1;
      } while (iVar4 != lVar15);
    }
  }
  else {
    this->pData = *(double **)(dst + 0xa0);
    psVar9 = boost::shared_array<double>::operator=
                       (&this->matrixParent,(shared_array<double> *)(dst + 0xa8));
    iVar4 = (int)psVar9;
  }
  return iVar4;
}

Assistant:

void Matrix::copy( const Matrix &m, bool deep )
{
	// copy main variables
	sMatrixName = m.sMatrixName;
	nMatrixDimension = m.nMatrixDimension;
	nData = m.nData;
	bReference = deep ? false : true;
	physicalDescription = m.physicalDescription;
	sMatrixName = m.sMatrixName;
	physicalUnit = m.physicalUnit;
	
	pPhysicals = new Physical[nMatrixDimension]();
	for( int i=0; i<nMatrixDimension; i++)
		pPhysicals[i] = Physical(m.pPhysicals[i]);

	pSize = new int[nMatrixDimension];
	for( int i=0; i<nMatrixDimension; i++ )
		pSize[i] = m.pSize[i];

	pMult = new int[nMatrixDimension];
	for( int i=0; i<nMatrixDimension; i++ )
		pMult[i] = m.pMult[i];		

	// copy all content if deep copy is wanted
	if( !bReference ) {
		pData = new double[nData];
		matrixParent =  shared_array<double>(pData, MatrixDataDeleter(this));
		for( int i=0; i<nData; i++ )
			pData[i] = m.pData[i];
	}
	// else copy only pointers
	else {
		pData = m.pData;
		matrixParent = m.matrixParent;
	}
}